

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multistream.h
# Opt level: O0

int __thiscall ipx::Multistream::multibuffer::overflow(multibuffer *this,int c)

{
  bool bVar1;
  reference ppbVar2;
  int in_ESI;
  long in_RDI;
  streambuf *b;
  iterator __end2;
  iterator __begin2;
  vector<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>
  *__range2;
  vector<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>
  *in_stack_ffffffffffffffc8;
  basic_streambuf<char,_std::char_traits<char>_> *in_stack_ffffffffffffffd0;
  __normal_iterator<std::basic_streambuf<char,_std::char_traits<char>_>_**,_std::vector<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>_>
  local_20;
  long local_18;
  int local_c;
  
  local_18 = in_RDI + 0x40;
  local_c = in_ESI;
  local_20._M_current =
       (basic_streambuf<char,_std::char_traits<char>_> **)
       std::
       vector<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>
       ::begin(in_stack_ffffffffffffffc8);
  std::
  vector<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>
  ::end(in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::basic_streambuf<char,_std::char_traits<char>_>_**,_std::vector<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<std::basic_streambuf<char,_std::char_traits<char>_>_**,_std::vector<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    ppbVar2 = __gnu_cxx::
              __normal_iterator<std::basic_streambuf<char,_std::char_traits<char>_>_**,_std::vector<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>_>
              ::operator*(&local_20);
    in_stack_ffffffffffffffd0 = *ppbVar2;
    std::streambuf::sputc((char)in_stack_ffffffffffffffd0);
    __gnu_cxx::
    __normal_iterator<std::basic_streambuf<char,_std::char_traits<char>_>_**,_std::vector<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>_>
    ::operator++(&local_20);
  }
  return local_c;
}

Assistant:

int overflow(int c) override {
            for (std::streambuf* b : buffers)
                b->sputc(static_cast<char>(c));
            return c;
        }